

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O2

size_t __thiscall spdlog::details::file_helper::size(file_helper *this)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  string local_28;
  
  if (this->fd_ != (FILE *)0x0) {
    sVar1 = details::os::filesize(this->fd_);
    return sVar1;
  }
  details::os::filename_to_str(&local_28,&this->filename_);
  std::operator+(&bStack_48,"Cannot use size() on closed file ",&local_28);
  throw_spdlog_ex(&bStack_48);
}

Assistant:

SPDLOG_INLINE size_t file_helper::size() const {
    if (fd_ == nullptr) {
        throw_spdlog_ex("Cannot use size() on closed file " + os::filename_to_str(filename_));
    }
    return os::filesize(fd_);
}